

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O0

int Abc_NtkCleanupNodes(Abc_Ntk_t *pNtk,Vec_Ptr_t *vRoots,int fVerbose)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *p;
  Abc_Obj_t *Entry;
  void *Entry_00;
  Abc_Obj_t **ppNodes;
  Vec_Ptr_t *vNodes_00;
  int local_3c;
  int Counter;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vStarts;
  Vec_Ptr_t *vNodes;
  int fVerbose_local;
  Vec_Ptr_t *vRoots_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                  ,0x1fc,"int Abc_NtkCleanupNodes(Abc_Ntk_t *, Vec_Ptr_t *, int)");
  }
  p = Vec_PtrAlloc(1000);
  for (local_3c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_3c < iVar1; local_3c = local_3c + 1) {
    Entry = Abc_NtkCo(pNtk,local_3c);
    Vec_PtrPush(p,Entry);
  }
  for (local_3c = 0; iVar1 = Vec_PtrSize(vRoots), local_3c < iVar1; local_3c = local_3c + 1) {
    Entry_00 = Vec_PtrEntry(vRoots,local_3c);
    if (Entry_00 != (void *)0x0) {
      Vec_PtrPush(p,Entry_00);
    }
  }
  ppNodes = (Abc_Obj_t **)Vec_PtrArray(p);
  iVar1 = Vec_PtrSize(p);
  vNodes_00 = Abc_NtkDfsNodes(pNtk,ppNodes,iVar1);
  Vec_PtrFree(p);
  uVar2 = Abc_NtkReduceNodes(pNtk,vNodes_00);
  if (fVerbose != 0) {
    printf("Cleanup removed %d dangling nodes.\n",(ulong)uVar2);
  }
  Vec_PtrFree(vNodes_00);
  return uVar2;
}

Assistant:

int Abc_NtkCleanupNodes( Abc_Ntk_t * pNtk, Vec_Ptr_t * vRoots, int fVerbose )
{
    Vec_Ptr_t * vNodes, * vStarts;
    Abc_Obj_t * pObj;
    int i, Counter;
    assert( Abc_NtkIsLogic(pNtk) );
    // collect starting nodes into one array
    vStarts = Vec_PtrAlloc( 1000 );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vStarts, pObj );
    Vec_PtrForEachEntry( Abc_Obj_t *, vRoots, pObj, i )
        if ( pObj )
            Vec_PtrPush( vStarts, pObj );
    // mark the nodes reachable from the POs
    vNodes = Abc_NtkDfsNodes( pNtk, (Abc_Obj_t **)Vec_PtrArray(vStarts), Vec_PtrSize(vStarts) );
    Vec_PtrFree( vStarts );
    Counter = Abc_NtkReduceNodes( pNtk, vNodes );
    if ( fVerbose )
        printf( "Cleanup removed %d dangling nodes.\n", Counter );
    Vec_PtrFree( vNodes );
    return Counter;
}